

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent
          (PathTypeHandlerWithAttr *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  bool bVar1;
  
  bVar1 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                    ((PathTypeHandlerBase *)this,type,(this->attributes).ptr,record,
                     failedPropertyIndex);
  return bVar1;
}

Assistant:

bool PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        return IsObjTypeSpecEquivalentHelper(type, attributes, record, failedPropertyIndex);
    }